

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cni.hpp
# Opt level: O2

void __thiscall
cs_impl::
cni_helper<void(*)(std::deque<cs_impl::any,std::allocator<cs_impl::any>>&,cs_impl::any_const&),void(*)(std::deque<cs_impl::any,std::allocator<cs_impl::any>>&,cs_impl::any_const&)>
::_call<0,1>(cni_helper<void(*)(std::deque<cs_impl::any,std::allocator<cs_impl::any>>&,cs_impl::any_const&),void(*)(std::deque<cs_impl::any,std::allocator<cs_impl::any>>&,cs_impl::any_const&)>
             *this,vector *args,sequence<0,_1> *param_2)

{
  deque<cs_impl::any,_std::allocator<cs_impl::any>_> *__args;
  
  __args = try_convert_and_check<std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>_&,_std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>_&,_std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>,_0UL>
           ::convert((args->super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl
                     .super__Vector_impl_data._M_start);
  std::
  function<void_(std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>_&,_const_cs_impl::any_&)>::
  operator()((function<void_(std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>_&,_const_cs_impl::any_&)>
              *)this,__args,
             (args->super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl.
             super__Vector_impl_data._M_start + 1);
  return;
}

Assistant:

void _call(cs::vector &args, const cov::sequence<S...> &) const
		{
			mFunc(try_convert<_Target_ArgsT, _Source_ArgsT, S>::convert(args[S])...);
		}